

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audit_regressor.cc
# Opt level: O1

base_learner * audit_regressor_setup(options_i *options,vw *all)

{
  undefined8 uVar1;
  undefined8 uVar2;
  long lVar3;
  int iVar4;
  long *__dest;
  audit_regressor_data *dat;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar5;
  io_buf *piVar6;
  base_learner *l;
  single_learner *base;
  learner<audit_regressor_data,_example> *plVar7;
  vw_exception *pvVar8;
  string out_file;
  size_type __dnew;
  option_group_definition new_options;
  stringstream __msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  long local_298;
  option_group_definition local_290;
  long *local_258;
  long local_250;
  long local_248 [2];
  string local_238;
  undefined7 *local_218;
  undefined8 local_210;
  undefined7 local_208;
  undefined1 uStack_201;
  undefined7 uStack_200;
  undefined1 local_1f9;
  string local_1f8;
  string local_1d8;
  undefined1 local_1b8 [23];
  undefined1 uStack_1a1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  string local_188 [64];
  bool local_148;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_130;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_120;
  
  local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
  local_2b8._M_string_length = 0;
  local_2b8.field_2._M_local_buf[0] = '\0';
  local_208 = 0x52207469647541;
  uStack_201 = 0x65;
  uStack_200 = 0x726f7373657267;
  local_210 = 0xf;
  local_1f9 = 0;
  local_290.m_name._M_dataplus._M_p = (pointer)&local_290.m_name.field_2;
  local_218 = &local_208;
  std::__cxx11::string::_M_construct<char*>((string *)&local_290,&local_208);
  local_290.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_290.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_290.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_218 != &local_208) {
    operator_delete(local_218);
  }
  local_238.field_2._M_allocated_capacity._0_7_ = 0x725f7469647561;
  local_238.field_2._M_local_buf[7] = 'e';
  local_238.field_2._8_7_ = 0x726f7373657267;
  local_238._M_string_length = 0xf;
  local_238.field_2._M_local_buf[0xf] = '\0';
  local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_1b8,&local_238,&local_2b8);
  local_148 = true;
  local_298 = 0x75;
  local_258 = local_248;
  __dest = (long *)std::__cxx11::string::_M_create((ulong *)&local_258,(ulong)&local_298);
  lVar3 = local_298;
  local_248[0] = local_298;
  local_258 = __dest;
  memcpy(__dest,
         "stores feature names and their regressor values. Same dataset must be used for both regressor training and this mode."
         ,0x75);
  local_250 = lVar3;
  *(undefined1 *)((long)__dest + lVar3) = 0;
  std::__cxx11::string::_M_assign(local_188);
  VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
            (&local_290,
             (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_1b8);
  if (local_258 != local_248) {
    operator_delete(local_258);
  }
  local_1b8._0_8_ = &PTR__typed_option_002d7080;
  if (local_120._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_120._M_pi);
  }
  if (local_130._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_130._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_1b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p);
  }
  (**options->_vptr_options_i)(options,&local_290);
  local_1b8._16_7_ = 0x725f7469647561;
  uStack_1a1 = 0x65;
  local_1a0._M_allocated_capacity._0_7_ = 0x726f7373657267;
  local_1b8._8_8_ = (pointer)0xf;
  local_1a0._M_local_buf[7] = '\0';
  local_1b8._0_8_ = local_1b8 + 0x10;
  iVar4 = (*options->_vptr_options_i[1])(options,local_1b8);
  if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
    operator_delete((void *)local_1b8._0_8_);
  }
  if ((char)iVar4 == '\0') {
    plVar7 = (learner<audit_regressor_data,_example> *)0x0;
  }
  else {
    if (local_2b8._M_string_length == 0) {
      std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1b8 + 0x10),
                 "audit_regressor argument (output filename) is missing.",0x36);
      pvVar8 = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (pvVar8,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/audit_regressor.cc"
                 ,0x106,&local_1d8);
      __cxa_throw(pvVar8,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    if (1 < all->numpasses) {
      std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1b8 + 0x10),"audit_regressor can\'t be used with --passes > 1.",
                 0x30);
      pvVar8 = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (pvVar8,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/audit_regressor.cc"
                 ,0x109,&local_1f8);
      __cxa_throw(pvVar8,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    all->audit = true;
    dat = calloc_or_throw<audit_regressor_data>(1);
    dat->all = (vw *)0x0;
    dat->increment = 0;
    dat->loaded_regressor_values = 0;
    dat->values_audited = 0;
    dat->ns_pre = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)0x0;
    dat->out_file = (io_buf *)0x0;
    dat->cur_class = 0;
    dat->total_class_cnt = 0;
    dat->all = all;
    pvVar5 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)operator_new(0x18);
    (pvVar5->
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pvVar5->
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (pvVar5->
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    dat->ns_pre = pvVar5;
    piVar6 = (io_buf *)operator_new(0xa8);
    piVar6->_vptr_io_buf = (_func_int **)&PTR_open_file_002d6fa8;
    (piVar6->space)._begin = (char *)0x0;
    (piVar6->space)._end = (char *)0x0;
    (piVar6->space).end_array = (char *)0x0;
    (piVar6->space).erase_count = 0;
    (piVar6->files)._begin = (int *)0x0;
    (piVar6->files)._end = (int *)0x0;
    (piVar6->files).end_array = (int *)0x0;
    (piVar6->files).erase_count = 0;
    (piVar6->currentname)._begin = (char *)0x0;
    (piVar6->currentname)._end = (char *)0x0;
    (piVar6->currentname).end_array = (char *)0x0;
    (piVar6->currentname).erase_count = 0;
    (piVar6->finalname)._begin = (char *)0x0;
    (piVar6->finalname)._end = (char *)0x0;
    (piVar6->finalname).end_array = (char *)0x0;
    (piVar6->finalname).erase_count = 0;
    v_array<char>::resize(&piVar6->space,0x10000);
    piVar6->count = 0;
    piVar6->current = 0;
    piVar6->head = (piVar6->space)._begin;
    piVar6->_verify_hash = false;
    piVar6->_hash = 0;
    dat->out_file = piVar6;
    (**piVar6->_vptr_io_buf)(piVar6,local_2b8._M_dataplus._M_p,(ulong)all->stdin_off,2);
    l = setup_base(options,all);
    base = LEARNER::as_singleline<char,char>(l);
    plVar7 = LEARNER::learner<audit_regressor_data,example>::
             init_learner<LEARNER::learner<char,example>>
                       (dat,base,audit_regressor,audit_regressor,1,
                        *(prediction_type_t *)(base + 0xd0));
    uVar1 = *(undefined8 *)(plVar7 + 0x18);
    uVar2 = *(undefined8 *)(plVar7 + 0x20);
    *(undefined8 *)(plVar7 + 0xa0) = uVar1;
    *(undefined8 *)(plVar7 + 0xa8) = uVar2;
    *(code **)(plVar7 + 0xb0) = end_examples;
    *(undefined8 *)(plVar7 + 0x58) = uVar1;
    *(code **)(plVar7 + 0x68) = finish_example;
    *(undefined8 *)(plVar7 + 0xb8) = uVar1;
    *(undefined8 *)(plVar7 + 0xc0) = uVar2;
    *(code **)(plVar7 + 200) = finish;
    *(undefined8 *)plVar7 = uVar1;
    *(undefined8 *)(plVar7 + 8) = uVar2;
    *(code **)(plVar7 + 0x10) = init_driver;
  }
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_290.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290.m_name._M_dataplus._M_p != &local_290.m_name.field_2) {
    operator_delete(local_290.m_name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
    operator_delete(local_2b8._M_dataplus._M_p);
  }
  return (base_learner *)plVar7;
}

Assistant:

LEARNER::base_learner* audit_regressor_setup(options_i& options, vw& all)
{
  string out_file;

  option_group_definition new_options("Audit Regressor");
  new_options.add(make_option("audit_regressor", out_file)
                      .keep()
                      .help("stores feature names and their regressor values. Same dataset must be used for both "
                            "regressor training and this mode."));
  options.add_and_parse(new_options);

  if (!options.was_supplied("audit_regressor"))
    return nullptr;

  if (out_file.empty())
    THROW("audit_regressor argument (output filename) is missing.");

  if (all.numpasses > 1)
    THROW("audit_regressor can't be used with --passes > 1.");

  all.audit = true;

  auto dat = scoped_calloc_or_throw<audit_regressor_data>();
  dat->all = &all;
  dat->ns_pre = new vector<string>();  // explicitly invoking vector's constructor
  dat->out_file = new io_buf();
  dat->out_file->open_file(out_file.c_str(), all.stdin_off, io_buf::WRITE);

  LEARNER::learner<audit_regressor_data, example>& ret =
      LEARNER::init_learner(dat, as_singleline(setup_base(options, all)), audit_regressor, audit_regressor, 1);
  ret.set_end_examples(end_examples);
  ret.set_finish_example(finish_example);
  ret.set_finish(finish);
  ret.set_init_driver(init_driver);

  return LEARNER::make_base<audit_regressor_data>(ret);
}